

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_GLSL_LIT(Context *ctx)

{
  uint uVar1;
  size_t in_R8;
  char src0 [64];
  char code [128];
  char acStack_d8 [64];
  char local_98 [136];
  
  make_GLSL_srcarg_string(ctx,0,0xf,acStack_d8,in_R8);
  if (ctx->glsl_generated_lit_helper == 0) {
    ctx->glsl_generated_lit_helper = 1;
    push_output(ctx,&ctx->helpers);
    output_line(ctx,"vec4 LIT(const vec4 src)");
    output_line(ctx,"{");
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"float power = clamp(src.w, -%s, %s);","127.9961");
    output_line(ctx,"vec4 retval = vec4(1.0, 0.0, 0.0, 1.0);");
    output_line(ctx,"if (src.x > 0.0) {");
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"retval.y = src.x;");
    output_line(ctx,"if (src.y > 0.0) {");
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"retval.z = pow(src.y, power);");
    ctx->indent = ctx->indent + -1;
    output_line(ctx,"}");
    ctx->indent = ctx->indent + -1;
    output_line(ctx,"}");
    output_line(ctx,"return retval;");
    ctx->indent = ctx->indent + -1;
    output_line(ctx,"}");
    if (ctx->output == (Buffer *)0x0) {
      __assert_fail("ctx->output != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x1d3,"void output_blank_line(Context *)");
    }
    if (ctx->isfail == 0) {
      buffer_append(ctx->output,ctx->endline,(long)ctx->endline_len);
    }
    if (ctx->output_stack_len < 1) {
      __assert_fail("ctx->output_stack_len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x173,"void pop_output(Context *)");
    }
    uVar1 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar1;
    ctx->output = ctx->output_stack[uVar1];
    ctx->indent = ctx->indent_stack[uVar1];
  }
  make_GLSL_destarg_assign(ctx,local_98,0x80,"LIT(%s)",acStack_d8);
  output_line(ctx,"%s",local_98);
  return;
}

Assistant:

static void emit_GLSL_LIT(Context *ctx)
{
    char src0[64]; make_GLSL_srcarg_string_full(ctx, 0, src0, sizeof (src0));
    char code[128];
    emit_GLSL_LIT_helper(ctx);
    make_GLSL_destarg_assign(ctx, code, sizeof (code), "LIT(%s)", src0);
    output_line(ctx, "%s", code);
}